

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-ir-builder.cpp
# Opt level: O0

Result<unsigned_int> * __thiscall
wasm::IRBuilder::addScratchLocal
          (Result<unsigned_int> *__return_storage_ptr__,IRBuilder *this,Type type)

{
  Function *func;
  Type in_R8;
  Name name_00;
  Index local_7c;
  string_view local_78;
  undefined1 local_68 [8];
  Name name;
  allocator<char> local_41;
  Err local_40;
  IRBuilder *local_20;
  IRBuilder *this_local;
  Type type_local;
  
  local_20 = this;
  this_local = (IRBuilder *)type.id;
  type_local.id = (uintptr_t)__return_storage_ptr__;
  if (this->func == (Function *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"scratch local required, but there is no function context",
               &local_41);
    Result<unsigned_int>::Result(__return_storage_ptr__,&local_40);
    wasm::Err::~Err(&local_40);
    std::allocator<char>::~allocator(&local_41);
  }
  else {
    func = this->func;
    wasm::Name::Name((Name *)&local_78,"scratch");
    _local_68 = (string_view)Names::getValidLocalName(func,(Name)local_78);
    name_00.super_IString.str._M_str = (char *)this_local;
    name_00.super_IString.str._M_len = name.super_IString.str._M_len;
    local_7c = Builder::addVar((Builder *)this->func,(Function *)local_68,name_00,in_R8);
    Result<unsigned_int>::Result<unsigned_int>(__return_storage_ptr__,&local_7c);
  }
  return __return_storage_ptr__;
}

Assistant:

Result<Index> IRBuilder::addScratchLocal(Type type) {
  if (!func) {
    return Err{"scratch local required, but there is no function context"};
  }
  Name name = Names::getValidLocalName(*func, "scratch");
  return Builder::addVar(func, name, type);
}